

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O1

char * __thiscall spdlog::details::os::getenv_abi_cxx11_(os *this,char *__name)

{
  char *__s;
  size_t sVar1;
  
  __s = ::getenv(__name);
  *(os **)this = this + 0x10;
  if (__s == (char *)0x0) {
    *(undefined8 *)(this + 8) = 0;
    this[0x10] = (os)0x0;
  }
  else {
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)this,__s,__s + sVar1);
  }
  return (char *)this;
}

Assistant:

std::string SPDLOG_INLINE getenv(const char *field) {
#if defined(_MSC_VER)
    #if defined(__cplusplus_winrt)
    return std::string{};  // not supported under uwp
    #else
    size_t len = 0;
    char buf[128];
    bool ok = ::getenv_s(&len, buf, sizeof(buf), field) == 0;
    return ok ? buf : std::string{};
    #endif
#else  // revert to getenv
    char *buf = ::getenv(field);
    return buf ? buf : std::string{};
#endif
}